

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  span<const_char> *__pipedes;
  int i;
  long lVar2;
  pipe<char> p;
  pipe<char> cq;
  MyQueue qu;
  pipe<int> iq;
  span<const_char> local_38;
  
  mtrace();
  mpt::pipe<char>::pipe(&p,(int *)0x0);
  qu.super_queue = (queue)0x61;
  mpt::pipe<char>::push(&p,(char *)&qu);
  qu.super_queue = (queue)0x6c;
  mpt::pipe<char>::push(&p,(char *)&qu);
  qu.super_queue = (queue)0x6c;
  mpt::pipe<char>::push(&p,(char *)&qu);
  qu.super_queue = (queue)0x6f;
  mpt::pipe<char>::push(&p,(char *)&qu);
  qu.super_queue = (queue)0x68;
  mpt::pipe<char>::unshift(&p,(char *)&qu);
  qu._0_16_ = mpt::pipe<char>::elements(&p);
  poVar1 = operator<<((ostream *)&std::cout,(span *)&qu);
  std::endl<char,std::char_traits<char>>(poVar1);
  qu._0_4_ = 5;
  mpt::pipe<int>::pipe(&iq,(int *)&qu);
  qu._0_16_ = mpt::pipe<int>::elements(&iq);
  poVar1 = operator<<((ostream *)&std::cout,(span<int> *)&qu);
  std::endl<char,std::char_traits<char>>(poVar1);
  qu.super_queue = (queue)0x61;
  mpt::pipe<char>::pipe(&cq,(int *)&qu);
  qu.super_queue = (queue)0x62;
  mpt::pipe<char>::push(&cq,(char *)&qu);
  qu._0_16_ = mpt::pipe<char>::elements(&cq);
  poVar1 = operator<<((ostream *)&std::cout,(span *)&qu);
  std::endl<char,std::char_traits<char>>(poVar1);
  MyQueue::MyQueue(&qu);
  mpt::io::queue::prepare((ulong)&qu);
  (**(code **)(qu._0_8_ + 0x48))(&qu,"hallo",5);
  local_38._base._0_1_ = 0x7b;
  (**(code **)(qu._0_8_ + 0x48))(&qu,&local_38,1);
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    MyQueue::add(&qu,argv[lVar2],-1);
  }
  local_38._base._0_1_ = 0x7d;
  (**(code **)(qu._0_8_ + 0x48))(&qu,&local_38,1);
  MyQueue::add(&qu,"hallo",-1);
  local_38._base._0_1_ = 0x74;
  (**(code **)(qu._0_8_ + 0x48))(&qu,&local_38,1);
  mpt::io::queue::shift(&qu,0);
  mpt::io::queue::shift(&qu,0);
  local_38 = MyQueue::string(&qu);
  __pipedes = &local_38;
  poVar1 = operator<<((ostream *)&std::cout,(span *)__pipedes);
  std::endl<char,std::char_traits<char>>(poVar1);
  mpt::io::queue::~queue(&qu.super_queue);
  mpt::pipe<char>::~pipe(&cq,(int *)__pipedes);
  mpt::pipe<int>::~pipe(&iq,(int *)__pipedes);
  mpt::pipe<char>::~pipe(&p,(int *)__pipedes);
  return 0;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::pipe<char> p;
	p.push('a');
	p.push('l');
	p.push('l');
	p.push('o');
	p.unshift('h');
	std::cout << p.elements() << std::endl;
	
	
	mpt::pipe<int> iq(5, 8);
	std::cout << iq.elements() << std::endl;
	
	mpt::pipe<char> cq('a', 4);
	cq.push('b');
	std::cout << cq.elements() << std::endl;
	
	
	MyQueue qu;
	qu.prepare(456);
	mpt::io::queue *raw = &qu;
	
	raw->push("hallo", 5);
	
	qu.add('{');
	for (int i = 1; i < argc; ++i) {
		qu.add(argv[i]);
	}
	qu.add('}');
	qu.add("hallo");
	qu.add('t');
	qu.shift(0, 1);
	qu.shift(0, 1);
	
	std::cout << qu.string() << std::endl;
	
	return 0;
}